

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Dict *pDVar3;
  Bool BVar4;
  uint uVar5;
  Node *pNVar6;
  uint code;
  Node *local_70;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (list == (Node *)0x0) {
    prvTidypopMemory(doc);
    list = memory.original_node;
  }
  else {
    memory.reentry_node = (Node *)0x0;
    memory.reentry_state = 0;
  }
  if ((list->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  pLVar1->insert = (IStack *)0x0;
  local_70 = (Node *)0x0;
LAB_00137ba1:
  do {
    do {
      if (memory.reentry_state != 0) {
        if (memory.reentry_state != 1) {
          if (memory.reentry_state != 2) {
            do {
            } while( true );
          }
          code = 0x25a;
          goto LAB_00137de0;
        }
        pLVar1->excludeBlocks = yes;
        memory.reentry_state = 0;
        if ((local_70 != (Node *)0x0) && (local_70->last == memory.reentry_node)) {
          list = prvTidyInferredTag(doc,TidyTag_DL);
          prvTidyInsertNodeAfterElement(memory.reentry_node,list);
          memory.reentry_state = 0;
        }
        goto LAB_00137ba1;
      }
      pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
      memory.reentry_state = 2;
      memory.reentry_node = (Node *)0x0;
    } while (pNVar6 == (Node *)0x0);
    if ((pNVar6->tag == list->tag) && (pNVar6->type == EndTag)) {
      prvTidyFreeNode(doc,pNVar6);
      list->closed = yes;
      return (Node *)0x0;
    }
    BVar4 = InsertMisc(list,pNVar6);
    memory.reentry_state = 0;
    memory.reentry_node = pNVar6;
  } while (BVar4 != no);
  BVar4 = prvTidynodeIsText(pNVar6);
  if (BVar4 != no) {
    prvTidyUngetToken(doc);
    memory.reentry_node = prvTidyInferredTag(doc,TidyTag_DT);
    prvTidyReport(doc,list,memory.reentry_node,0x261);
  }
  pDVar2 = (memory.reentry_node)->tag;
  if (pDVar2 != (Dict *)0x0) {
    if ((memory.reentry_node)->type == EndTag) {
      pNVar6 = list;
      if (pDVar2->id == TidyTag_FORM) {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
        memory.reentry_state = 0;
        prvTidyReport(doc,list,memory.reentry_node,0x235);
        prvTidyFreeNode(doc,memory.reentry_node);
        goto LAB_00137ba1;
      }
      while (pNVar6 = pNVar6->parent, pNVar6 != (Node *)0x0) {
        pDVar3 = pNVar6->tag;
        if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_BODY)) {
          memory.reentry_state = 0;
          prvTidyReport(doc,list,memory.reentry_node,0x235);
          prvTidyFreeNode(doc,memory.reentry_node);
          local_70 = pNVar6;
          goto LAB_00137ba1;
        }
        if (pDVar2 == pDVar3) {
          prvTidyReport(doc,list,memory.reentry_node,0x259);
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
      }
      local_70 = (Node *)0x0;
      if (memory.reentry_node != (Node *)0x0) goto LAB_00137d1f;
switchD_00137d39_caseD_1:
      prvTidyUngetToken(doc);
      uVar5 = (memory.reentry_node)->tag->model;
      if ((uVar5 & 0x18) == 0) {
        code = 0x27e;
LAB_00137de0:
        prvTidyReport(doc,list,memory.reentry_node,code);
        return (Node *)0x0;
      }
      if (((uVar5 & 0x10) == 0) && (pLVar1->excludeBlocks != no)) {
        return (Node *)0x0;
      }
      memory.reentry_node = prvTidyInferredTag(doc,TidyTag_DD);
      prvTidyReport(doc,list,memory.reentry_node,0x261);
    }
    else {
LAB_00137d1f:
      uVar5 = pDVar2->id - TidyTag_CENTER;
      switch(uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) {
      case 0:
        if (list->content == (Node *)0x0) {
          prvTidyInsertNodeBeforeElement(list,memory.reentry_node);
        }
        else {
          prvTidyInsertNodeAfterElement(list,memory.reentry_node);
        }
        pLVar1->excludeBlocks = no;
        memory.reentry_mode = IgnoreWhitespace;
        memory.reentry_state = 1;
        goto LAB_00137e61;
      default:
        goto switchD_00137d39_caseD_1;
      case 3:
      case 6:
        break;
      case 5:
        BVar4 = prvTidyIsHTML5Mode(doc);
        if (BVar4 == no) goto switchD_00137d39_caseD_1;
      }
    }
    if ((memory.reentry_node)->type != EndTag) {
      prvTidyInsertNodeAtEnd(list,memory.reentry_node);
      memory.reentry_mode = IgnoreWhitespace;
      memory.reentry_state = 0;
LAB_00137e61:
      prvTidypushMemory(doc,(TidyParserMemory)
                            ZEXT3248(CONCAT824(memory._24_8_,
                                               CONCAT816(memory.reentry_node,
                                                         CONCAT88(list,prvTidyParseDefList)))));
      return memory.reentry_node;
    }
  }
  memory.reentry_state = 0;
  prvTidyReport(doc,list,memory.reentry_node,0x235);
  prvTidyFreeNode(doc,memory.reentry_node);
  goto LAB_00137ba1;
}

Assistant:

Node* TY_(ParseDefList)( TidyDocImpl* doc, Node *list, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISCENTER,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);
    }

    if (list->tag->model & CM_EMPTY)
        return NULL;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)( doc, IgnoreWhitespace);
        
        switch ( state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }

                if (node->tag == list->tag && node->type == EndTag)
                {
                    TY_(FreeNode)( doc, node);
                    list->closed = yes;
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(list, node))
                    continue;

                if (TY_(nodeIsText)(node))
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DT);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    Bool discardIt = no;
                    if ( nodeIsFORM(node) )
                    {
                        BadForm( doc );
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    for (parent = list->parent;
                            parent != NULL; parent = parent->parent)
                    {
                       /* Do not match across BODY to avoid infinite loop
                          between ParseBody and this parser,
                          See http://tidy.sf.net/bug/1098012. */
                        if (nodeIsBODY(parent))
                        {
                            discardIt = yes;
                            break;
                        }
                        if (node->tag == parent->tag)
                        {
                            TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                            TY_(UngetToken)( doc );

                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                    if (discardIt)
                    {
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* center in a dt or a dl breaks the dl list in two */
                if ( nodeIsCENTER(node) )
                {
                    if (list->content)
                        TY_(InsertNodeAfterElement)(list, node);
                    else /* trim empty dl list */
                    {
                        TY_(InsertNodeBeforeElement)(list, node);
                    }

                    /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                                 Gary Dechaines 11 Aug 00 */
                    /* ParseTag can destroy node, if it finds that
                     * this <center> is followed immediately by </center>.
                     * It's awkward but necessary to determine if this
                     * has happened.
                     */
                    parent = node->parent;

                    /* and parse contents of center */
                    lexer->excludeBlocks = no;

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseDefList);
                        memory.original_node = list;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_POST_NODEISCENTER;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( !( nodeIsDT(node) || nodeIsDD(node) || ( nodeIsDIV(node) && TY_(IsHTML5Mode)(doc) ) ) )
                {
                    TY_(UngetToken)( doc );

                    if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
                    {
                        TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* if DD appeared directly in BODY then exclude blocks */
                    if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DD);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <DT> or <DD> or <DIV>*/
                TY_(InsertNodeAtEnd)(list, node);
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseDefList);
                    memory.original_node = list;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_INITIAL;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT;
                    return node;
                }
            } break;


            case STATE_POST_NODEISCENTER:
            {
                lexer->excludeBlocks = yes;

                /* now create a new dl element,
                 * unless node has been blown away because the
                 * center was empty, as above.
                 */
                if (parent && parent->last == node)
                {
                    list = TY_(InferredTag)(doc, TidyTag_DL);
                    TY_(InsertNodeAfterElement)(node, list);
                }
                state = STATE_INITIAL;
                continue;
            } break;


            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}